

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_prn.cc
# Opt level: O0

int X509V3_EXT_print_fp(FILE *out,X509_EXTENSION *ext,int flag,int indent)

{
  BIO *out_00;
  int ret;
  BIO *bio_tmp;
  int indent_local;
  int flag_local;
  X509_EXTENSION *ext_local;
  FILE *fp_local;
  
  out_00 = BIO_new_fp(out,0);
  if (out_00 == (BIO *)0x0) {
    fp_local._4_4_ = 0;
  }
  else {
    fp_local._4_4_ = X509V3_EXT_print(out_00,ext,(long)flag,indent);
    BIO_free(out_00);
  }
  return fp_local._4_4_;
}

Assistant:

int X509V3_EXT_print_fp(FILE *fp, const X509_EXTENSION *ext, int flag,
                        int indent) {
  BIO *bio_tmp;
  int ret;
  if (!(bio_tmp = BIO_new_fp(fp, BIO_NOCLOSE))) {
    return 0;
  }
  ret = X509V3_EXT_print(bio_tmp, ext, flag, indent);
  BIO_free(bio_tmp);
  return ret;
}